

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaPrs.h
# Opt level: O0

void Prs_NtkAddBox(Prs_Ntk_t *p,int ModName,int InstName,Vec_Int_t *vTemp)

{
  int iVar1;
  uint uVar2;
  int Value;
  Vec_Int_t *vTemp_local;
  int InstName_local;
  int ModName_local;
  Prs_Ntk_t *p_local;
  
  iVar1 = Vec_IntSize(vTemp);
  if (iVar1 % 2 != 0) {
    __assert_fail("Vec_IntSize(vTemp) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaPrs.h"
                  ,0x10d,"void Prs_NtkAddBox(Prs_Ntk_t *, int, int, Vec_Int_t *)");
  }
  uVar2 = Vec_IntSize(&p->vBoxes);
  if ((uVar2 & 1) == 0) {
    Vec_IntPush(&p->vBoxes,-1);
  }
  uVar2 = Vec_IntSize(&p->vBoxes);
  if ((uVar2 & 1) != 0) {
    Vec_IntPush(&p->vObjs,uVar2);
    iVar1 = Vec_IntSize(vTemp);
    Vec_IntPush(&p->vBoxes,iVar1 + 2);
    Vec_IntPush(&p->vBoxes,ModName);
    Vec_IntPush(&p->vBoxes,InstName);
    Vec_IntAppend(&p->vBoxes,vTemp);
    return;
  }
  __assert_fail("Value & 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaPrs.h"
                ,0x111,"void Prs_NtkAddBox(Prs_Ntk_t *, int, int, Vec_Int_t *)");
}

Assistant:

static inline void Prs_NtkAddBox( Prs_Ntk_t * p, int ModName, int InstName, Vec_Int_t * vTemp )
{
    int Value;
    assert( Vec_IntSize(vTemp) % 2 == 0 );
    if ( !(Vec_IntSize(&p->vBoxes) & 1) )
        Vec_IntPush(&p->vBoxes, -1);
    Value = Vec_IntSize(&p->vBoxes);
    assert( Value & 1 );
    Vec_IntPush( &p->vObjs, Value );
    // create entry
    Vec_IntPush( &p->vBoxes, Vec_IntSize(vTemp)+2 );
    Vec_IntPush( &p->vBoxes, ModName );
    Vec_IntPush( &p->vBoxes, InstName );
    Vec_IntAppend( &p->vBoxes, vTemp );
}